

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

void tinyobj::LoadMtl(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      *material_map,
                     vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
                     istream *inStream,string *warning,string *err)

{
  char cVar1;
  char cVar2;
  pointer pmVar3;
  pointer pmVar4;
  _Alloc_hider _Var5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  long extraout_RAX;
  undefined8 extraout_RAX_00;
  ostream *poVar9;
  char *pcVar10;
  uint7 extraout_var;
  undefined8 extraout_RAX_01;
  undefined8 uVar11;
  texture_option_t *texopt;
  string *psVar12;
  real_t rVar13;
  undefined1 auVar14 [16];
  char *local_b28;
  char *local_b20;
  uint local_b18;
  uint local_b14;
  pointer local_b10;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *local_b08;
  undefined4 local_afc;
  real_t b;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_ad8;
  string linebuf;
  real_t g;
  char local_aa0 [16];
  string *local_a90;
  undefined1 local_a88 [1824];
  _Rb_tree_node_base local_368;
  size_t local_348;
  stringstream sstr;
  ostream local_330 [16];
  int local_320;
  stringstream warn_ss;
  ostream local_1a8 [376];
  
  local_a88._0_8_ = local_a88 + 0x10;
  local_a88._112_8_ = local_a88 + 0x80;
  local_368._M_left = &local_368;
  local_a88._8_8_ = 0;
  local_a88[0x10] = '\0';
  local_a88._144_8_ = local_a88 + 0xa0;
  local_a88._120_8_ = 0;
  local_a88[0x80] = '\0';
  local_a88._176_8_ = local_a88 + 0xc0;
  local_a88._152_8_ = 0;
  local_a88[0xa0] = '\0';
  local_a88._208_8_ = local_a88 + 0xe0;
  local_a88._184_8_ = 0;
  local_a88[0xc0] = '\0';
  local_a88._240_8_ = local_a88 + 0x100;
  local_a88._216_8_ = 0;
  local_a88[0xe0] = '\0';
  local_a88._272_8_ = local_a88 + 0x120;
  local_a88._248_8_ = 0;
  local_a88[0x100] = '\0';
  local_a88._304_8_ = local_a88 + 0x140;
  local_a88._280_8_ = 0;
  local_a88[0x120] = '\0';
  local_a88._336_8_ = local_a88 + 0x160;
  local_a88._312_8_ = 0;
  local_a88[0x140] = '\0';
  local_a88._432_8_ = local_a88 + 0x1c0;
  local_a88._344_8_ = 0;
  local_a88[0x160] = '\0';
  local_a88._528_8_ = local_a88 + 0x220;
  local_a88._440_8_ = 0;
  local_a88[0x1c0] = '\0';
  local_a88._624_8_ = local_a88 + 0x280;
  local_a88._536_8_ = 0;
  local_a88[0x220] = '\0';
  local_a88._720_8_ = local_a88 + 0x2e0;
  local_a88._632_8_ = 0;
  local_a88[0x280] = '\0';
  local_a88._816_8_ = local_a88 + 0x340;
  local_a88._728_8_ = 0;
  local_a88[0x2e0] = '\0';
  local_a88._912_8_ = local_a88 + 0x3a0;
  local_a88._824_8_ = 0;
  local_a88[0x340] = '\0';
  local_a88._1008_8_ = local_a88 + 0x400;
  local_a88._920_8_ = 0;
  local_a88[0x3a0] = '\0';
  local_a88._1104_8_ = local_a88 + 0x460;
  local_a88._1016_8_ = 0;
  local_a88[0x400] = '\0';
  local_a88._1168_8_ = local_a88 + 0x4a0;
  local_a88._1112_8_ = 0;
  local_a88[0x460] = '\0';
  local_a88._1200_8_ = local_a88 + 0x4c0;
  local_a88._1176_8_ = 0;
  local_a88[0x4a0] = '\0';
  local_a88._1232_8_ = local_a88 + 0x4e0;
  local_a88._1208_8_ = 0;
  local_a88[0x4c0] = '\0';
  local_a88._1264_8_ = local_a88 + 0x500;
  local_a88._1240_8_ = 0;
  local_a88[0x4e0] = '\0';
  local_a88._1296_8_ = local_a88 + 0x520;
  local_a88._1272_8_ = 0;
  local_a88[0x500] = '\0';
  local_a88._1392_8_ = local_a88 + 0x580;
  local_a88._1304_8_ = 0;
  local_a88[0x520] = '\0';
  local_a88._1488_8_ = local_a88 + 0x5e0;
  local_a88._1400_8_ = 0;
  local_a88[0x580] = '\0';
  local_a88._1584_8_ = local_a88 + 0x640;
  local_a88._1496_8_ = 0;
  local_a88[0x5e0] = '\0';
  local_a88._1680_8_ = local_a88 + 0x6a0;
  local_a88._1592_8_ = 0;
  local_a88[0x640] = '\0';
  local_a88._1776_8_ = local_a88 + 0x700;
  local_a88._1688_8_ = 0;
  local_a88[0x6a0] = '\0';
  local_a88._1784_8_ = 0;
  local_a88[0x700] = '\0';
  local_368._M_color = _S_red;
  local_368._M_parent = (_Base_ptr)0x0;
  local_348 = 0;
  local_b08 = materials;
  local_ad8 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
               *)material_map;
  local_368._M_right = local_368._M_left;
  InitMaterial((material_t *)local_a88);
  local_a90 = warning;
  std::__cxx11::stringstream::stringstream((stringstream *)&warn_ss);
  linebuf._M_dataplus._M_p = (pointer)&linebuf.field_2;
  local_b14 = 0;
  linebuf._M_string_length = 0;
  linebuf.field_2._M_local_buf[0] = '\0';
LAB_00e5981e:
  local_b10 = (pointer)((ulong)local_b10 & 0xffffffff00000000);
  local_b18 = 0;
LAB_00e5982e:
  do {
    do {
      do {
        iVar6 = std::istream::peek();
        if (iVar6 == -1) {
          pmVar3 = (local_b08->
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          pmVar4 = (local_b08->
                   super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
          std::__cxx11::string::string((string *)&sstr,(string *)local_a88);
          local_320 = (int)(((long)pmVar4 - (long)pmVar3) / 0x748);
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
          ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
                    (local_ad8,
                     (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                      *)&sstr);
          std::__cxx11::string::~string((string *)&sstr);
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
                    (local_b08,(value_type *)local_a88);
          psVar12 = local_a90;
          if (local_a90 != (string *)0x0) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)psVar12,(string *)&sstr);
            std::__cxx11::string::~string((string *)&sstr);
          }
          std::__cxx11::string::~string((string *)&linebuf);
          std::__cxx11::stringstream::~stringstream((stringstream *)&warn_ss);
          material_t::~material_t((material_t *)local_a88);
          return;
        }
        safeGetline(inStream,&linebuf);
      } while (linebuf._M_string_length == 0);
      lVar7 = std::__cxx11::string::find_last_not_of((char *)&linebuf,0xf4de0e);
      lVar7 = lVar7 + 1;
      std::__cxx11::string::substr((ulong)&sstr,(ulong)&linebuf);
      std::__cxx11::string::operator=((string *)&linebuf,(string *)&sstr);
      std::__cxx11::string::~string((string *)&sstr);
    } while (((linebuf._M_string_length == 0) ||
             ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\n' &&
              (std::__cxx11::string::erase((ulong)&linebuf,linebuf._M_string_length - 1),
              linebuf._M_string_length == 0)))) ||
            ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\r' &&
             (std::__cxx11::string::erase((ulong)&linebuf,linebuf._M_string_length - 1),
             linebuf._M_string_length == 0))));
    _Var5._M_p = linebuf._M_dataplus._M_p;
    sVar8 = strspn(linebuf._M_dataplus._M_p," \t");
    local_b28 = _Var5._M_p + sVar8;
    if (_Var5._M_p == (pointer)0x0) {
      __assert_fail("token",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/tinyobjloader/tiny_obj_loader.h"
                    ,0x6b3,
                    "void tinyobj::LoadMtl(std::map<std::string, int> *, std::vector<material_t> *, std::istream *, std::string *, std::string *)"
                   );
    }
    cVar1 = *local_b28;
  } while ((cVar1 == '\0') || (cVar1 == '#'));
  local_b20 = local_b28;
  iVar6 = strncmp(local_b28,"newmtl",6);
  if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) goto LAB_00e5a536;
  if (cVar1 != 'T') {
    if (cVar1 != 'N') {
      if (cVar1 == 'K') {
        cVar2 = local_b20[1];
        if (cVar2 == 't') {
          if ((local_b20[2] == '\t') || (local_b20[2] == ' ')) goto LAB_00e59c30;
          goto LAB_00e59c8f;
        }
        if (cVar2 == 'd') {
          if ((local_b20[2] != ' ') && (local_b20[2] != '\t')) goto LAB_00e59c8f;
          local_b28 = local_b20 + 2;
          parseReal3((real_t *)&sstr,&g,&b,&local_b28,0.0,0.0,0.0);
          local_a88._48_4_ = g;
          local_a88._44_4_ = _sstr;
          local_a88._52_4_ = b;
          lVar7 = extraout_RAX;
LAB_00e5a24e:
          local_b14 = (uint)CONCAT71((int7)((ulong)lVar7 >> 8),1);
          goto LAB_00e5982e;
        }
        if (cVar2 == 'e') {
          if ((local_b20[2] == ' ') || (local_b20[2] == '\t')) {
            local_b28 = local_b20 + 2;
            parseReal3((real_t *)&sstr,&g,&b,&local_b28,0.0,0.0,0.0);
            local_a88._84_4_ = g;
            goto LAB_00e5982e;
          }
        }
        else {
          if (cVar2 != 's') {
            if ((cVar2 != 'a') || ((local_b20[2] != ' ' && (local_b20[2] != '\t'))))
            goto LAB_00e59c8f;
            local_b28 = local_b20 + 2;
            parseReal3((real_t *)&sstr,&g,&b,&local_b28,0.0,0.0,0.0);
            local_a88._36_4_ = g;
            goto LAB_00e5982e;
          }
          if ((local_b20[2] == ' ') || (local_b20[2] == '\t')) {
            local_b28 = local_b20 + 2;
            parseReal3((real_t *)&sstr,&g,&b,&local_b28,0.0,0.0,0.0);
            local_a88._60_4_ = g;
            goto LAB_00e5982e;
          }
        }
      }
LAB_00e59c8f:
      uVar11 = 0;
      goto LAB_00e59c91;
    }
    if (local_b20[1] == 's') {
      if ((local_b20[2] != ' ') && (local_b20[2] != '\t')) goto LAB_00e59c8f;
      local_b28 = local_b20 + 2;
      local_a88._92_4_ = parseReal(&local_b28,0.0);
    }
    else {
      if ((local_b20[1] != 'i') || ((local_b20[2] != ' ' && (local_b20[2] != '\t'))))
      goto LAB_00e59c8f;
      local_b28 = local_b20 + 2;
      local_a88._96_4_ = parseReal(&local_b28,0.0);
    }
    goto LAB_00e5982e;
  }
  uVar11 = CONCAT71((int7)((ulong)lVar7 >> 8),1);
  if ((local_b20[1] == 'f') && ((local_b20[2] == ' ' || (local_b20[2] == '\t')))) {
LAB_00e59c30:
    local_b28 = local_b20 + 2;
    parseReal3((real_t *)&sstr,&g,&b,&local_b28,0.0,0.0,0.0);
    local_a88._72_4_ = g;
    goto LAB_00e5982e;
  }
LAB_00e59c91:
  local_afc = (undefined4)uVar11;
  iVar6 = strncmp(local_b20,"illum",5);
  if ((iVar6 == 0) && ((local_b20[5] == ' ' || (local_b20[5] == '\t')))) {
    local_b28 = local_b20 + 6;
    local_a88._104_4_ = parseInt(&local_b28);
    goto LAB_00e5982e;
  }
  if ((cVar1 == 'd') && ((local_b20[1] == ' ' || (local_b20[1] == '\t')))) {
    local_b28 = local_b20 + 1;
    local_a88._100_4_ = parseReal(&local_b28,0.0);
    if (((ulong)local_b10 & 1) == 0) {
      local_b10 = (pointer)((ulong)local_b10 & 0xffffffff00000000);
      local_b18 = (uint)CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
      goto LAB_00e5982e;
    }
  }
  else {
    if ((((char)local_afc == '\0') || (local_b20[1] != 'r')) ||
       ((local_b20[2] != ' ' && (local_b20[2] != '\t')))) {
      if (cVar1 == 'P') {
        cVar1 = local_b20[1];
        if (cVar1 == 'c') {
          if ((local_b20[2] == ' ') || (local_b20[2] == '\t')) {
            local_b28 = local_b20 + 2;
            local_a88._1148_4_ = parseReal(&local_b28,0.0);
            goto LAB_00e5982e;
          }
        }
        else if (cVar1 == 'm') {
          if ((local_b20[2] == ' ') || (local_b20[2] == '\t')) {
            local_b28 = local_b20 + 2;
            local_a88._1140_4_ = parseReal(&local_b28,0.0);
            goto LAB_00e5982e;
          }
        }
        else if (cVar1 == 's') {
          if ((local_b20[2] == ' ') || (local_b20[2] == '\t')) {
            local_b28 = local_b20 + 2;
            local_a88._1144_4_ = parseReal(&local_b28,0.0);
            goto LAB_00e5982e;
          }
        }
        else if ((cVar1 == 'r') && ((local_b20[2] == ' ' || (local_b20[2] == '\t')))) {
          local_b28 = local_b20 + 2;
          local_a88._1136_4_ = parseReal(&local_b28,0.0);
          goto LAB_00e5982e;
        }
        if (((local_b20[1] == 'c') && (local_b20[2] == 'r')) &&
           ((local_b20[3] == ' ' || (local_b20[3] == '\t')))) {
          local_b28 = local_b20 + 4;
          local_a88._1152_4_ = parseReal(&local_b28,0.0);
          goto LAB_00e5982e;
        }
      }
      iVar6 = strncmp(local_b20,"aniso",5);
      if ((iVar6 == 0) && ((local_b20[5] == ' ' || (local_b20[5] == '\t')))) {
        local_b28 = local_b20 + 6;
        local_a88._1156_4_ = parseReal(&local_b28,0.0);
        goto LAB_00e5982e;
      }
      iVar6 = strncmp(local_b20,"anisor",6);
      if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
        local_b28 = local_b20 + 7;
        local_a88._1160_4_ = parseReal(&local_b28,0.0);
        goto LAB_00e5982e;
      }
      iVar6 = strncmp(local_b20,"map_Ka",6);
      if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
        local_b28 = local_b20 + 7;
        texopt = (texture_option_t *)(local_a88 + 0x170);
        psVar12 = (string *)(local_a88 + 0x70);
        local_b20 = local_b28;
      }
      else {
        iVar6 = strncmp(local_b20,"map_Kd",6);
        if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
          local_b28 = local_b20 + 7;
          ParseTextureNameAndOption
                    ((string *)(local_a88 + 0x90),(texture_option_t *)(local_a88 + 0x1d0),local_b28)
          ;
          lVar7 = (ulong)extraout_var << 8;
          if ((local_b14 & 1) != 0) goto LAB_00e5a24e;
          auVar14._8_4_ = 0x3f19999a;
          auVar14._0_8_ = 0x3f19999a3f19999a;
          auVar14._12_4_ = 0x3f19999a;
          local_b14 = 0;
          local_a88._44_8_ = vmovlps_avx(auVar14);
          local_a88._52_4_ = 0.6;
          goto LAB_00e5982e;
        }
        iVar6 = strncmp(local_b20,"map_Ks",6);
        if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
          local_b28 = local_b20 + 7;
          texopt = (texture_option_t *)(local_a88 + 0x230);
          psVar12 = (string *)(local_a88 + 0xb0);
          local_b20 = local_b28;
        }
        else {
          iVar6 = strncmp(local_b20,"map_Ns",6);
          if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
            local_b28 = local_b20 + 7;
            texopt = (texture_option_t *)(local_a88 + 0x290);
            psVar12 = (string *)(local_a88 + 0xd0);
            local_b20 = local_b28;
          }
          else {
            iVar6 = strncmp(local_b20,"map_bump",8);
            if (((iVar6 == 0) && ((local_b20[8] == ' ' || (local_b20[8] == '\t')))) ||
               ((iVar6 = strncmp(local_b20,"map_Bump",8), iVar6 == 0 &&
                ((local_b20[8] == ' ' || (local_b20[8] == '\t')))))) {
              local_b28 = local_b20 + 9;
            }
            else {
              iVar6 = strncmp(local_b20,"bump",4);
              if ((iVar6 != 0) || ((local_b20[4] != ' ' && (local_b20[4] != '\t')))) {
                iVar6 = strncmp(local_b20,"map_d",5);
                if ((iVar6 == 0) && ((local_b20[5] == ' ' || (local_b20[5] == '\t')))) {
                  local_b28 = local_b20 + 6;
                  psVar12 = (string *)(local_a88 + 0x130);
                  local_b20 = local_b28;
                  std::__cxx11::string::assign((char *)psVar12);
                  texopt = (texture_option_t *)(local_a88 + 0x3b0);
                  goto LAB_00e5a379;
                }
                iVar6 = strncmp(local_b20,"disp",4);
                if ((iVar6 == 0) && ((local_b20[4] == ' ' || (local_b20[4] == '\t')))) {
                  local_b28 = local_b20 + 5;
                  texopt = (texture_option_t *)(local_a88 + 0x350);
                  psVar12 = (string *)(local_a88 + 0x110);
                  local_b20 = local_b28;
                }
                else {
                  iVar6 = strncmp(local_b20,"refl",4);
                  if ((iVar6 == 0) && ((local_b20[4] == ' ' || (local_b20[4] == '\t')))) {
                    local_b28 = local_b20 + 5;
                    texopt = (texture_option_t *)(local_a88 + 0x410);
                    psVar12 = (string *)(local_a88 + 0x150);
                    local_b20 = local_b28;
                  }
                  else {
                    iVar6 = strncmp(local_b20,"map_Pr",6);
                    if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
                      local_b28 = local_b20 + 7;
                      texopt = (texture_option_t *)(local_a88 + 0x530);
                      psVar12 = (string *)(local_a88 + 0x490);
                      local_b20 = local_b28;
                    }
                    else {
                      iVar6 = strncmp(local_b20,"map_Pm",6);
                      if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
                        local_b28 = local_b20 + 7;
                        texopt = (texture_option_t *)(local_a88 + 0x590);
                        psVar12 = (string *)(local_a88 + 0x4b0);
                        local_b20 = local_b28;
                      }
                      else {
                        iVar6 = strncmp(local_b20,"map_Ps",6);
                        if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
                          local_b28 = local_b20 + 7;
                          texopt = (texture_option_t *)(local_a88 + 0x5f0);
                          psVar12 = (string *)(local_a88 + 0x4d0);
                          local_b20 = local_b28;
                        }
                        else {
                          iVar6 = strncmp(local_b20,"map_Ke",6);
                          if ((iVar6 == 0) && ((local_b20[6] == ' ' || (local_b20[6] == '\t')))) {
                            local_b28 = local_b20 + 7;
                            texopt = (texture_option_t *)(local_a88 + 0x650);
                            psVar12 = (string *)(local_a88 + 0x4f0);
                            local_b20 = local_b28;
                          }
                          else {
                            iVar6 = strncmp(local_b20,"norm",4);
                            if ((iVar6 != 0) || ((local_b20[4] != ' ' && (local_b20[4] != '\t')))) {
                              pcVar10 = strchr(local_b20,0x20);
                              if ((pcVar10 != (char *)0x0) ||
                                 (pcVar10 = strchr(local_b20,9), pcVar10 != (char *)0x0)) {
                                _g = local_aa0;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&g,local_b20,pcVar10);
                                std::__cxx11::string::string
                                          ((string *)&b,pcVar10 + 1,(allocator *)&sstr);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&sstr,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&g,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&b);
                                std::
                                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                ::
                                _M_emplace_unique<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                            *)(local_a88 + 0x718),
                                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&sstr);
                                std::
                                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&sstr);
                                std::__cxx11::string::~string((string *)&b);
                                std::__cxx11::string::~string((string *)&g);
                              }
                              goto LAB_00e5982e;
                            }
                            local_b28 = local_b20 + 5;
                            texopt = (texture_option_t *)(local_a88 + 0x6b0);
                            psVar12 = (string *)(local_a88 + 0x510);
                            local_b20 = local_b28;
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_00e5a379;
              }
              local_b28 = local_b20 + 5;
            }
            psVar12 = (string *)(local_a88 + 0xf0);
            texopt = (texture_option_t *)(local_a88 + 0x2f0);
            local_b20 = local_b28;
          }
        }
      }
LAB_00e5a379:
      ParseTextureNameAndOption(psVar12,texopt,local_b20);
      goto LAB_00e5982e;
    }
    local_b28 = local_b20 + 2;
    if ((local_b18 & 1) == 0) {
      rVar13 = parseReal(&local_b28,0.0);
      local_b18 = 0;
      local_b10 = (pointer)CONCAT44(local_b10._4_4_,
                                    (int)CONCAT71((int7)((ulong)extraout_RAX_01 >> 8),1));
      local_a88._100_4_ = 1.0 - rVar13;
      goto LAB_00e5982e;
    }
  }
  poVar9 = std::operator<<(local_1a8,"Both `d` and `Tr` parameters defined for \"");
  poVar9 = std::operator<<(poVar9,(string *)local_a88);
  poVar9 = std::operator<<(poVar9,"\". Use the value of `d` for dissolve (line ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9," in .mtl.)");
  local_b10 = (pointer)CONCAT44(local_b10._4_4_,(int)CONCAT71((int7)((ulong)uVar11 >> 8),1));
  poVar9 = std::endl<char,std::char_traits<char>>(poVar9);
  local_b18 = (uint)CONCAT71((int7)((ulong)poVar9 >> 8),1);
  goto LAB_00e5982e;
LAB_00e5a536:
  if (local_a88._8_8_ != 0) {
    local_b10 = (local_b08->
                super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>).
                _M_impl.super__Vector_impl_data._M_start;
    pmVar3 = (local_b08->
             super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::string((string *)&sstr,(string *)local_a88);
    local_320 = (int)(((long)pmVar3 - (long)local_b10) / 0x748);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,int>>
              (local_ad8,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *)&sstr);
    std::__cxx11::string::~string((string *)&sstr);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::push_back
              (local_b08,(value_type *)local_a88);
  }
  InitMaterial((material_t *)local_a88);
  pcVar10 = local_b20 + 7;
  local_b28 = pcVar10;
  std::__cxx11::stringstream::stringstream((stringstream *)&sstr);
  std::operator<<(local_330,pcVar10);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_a88,(string *)&g);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::stringstream::~stringstream((stringstream *)&sstr);
  goto LAB_00e5981e;
}

Assistant:

void LoadMtl(std::map<std::string, int> *material_map,
             std::vector<material_t> *materials, std::istream *inStream,
             std::string *warning, std::string *err) {
  (void)err;

  // Create a default material anyway.
  material_t material;
  InitMaterial(&material);

  // Issue 43. `d` wins against `Tr` since `Tr` is not in the MTL specification.
  bool has_d = false;
  bool has_tr = false;

  // has_kd is used to set a default diffuse value when map_Kd is present
  // and Kd is not.
  bool has_kd = false;

  std::stringstream warn_ss;

  size_t line_no = 0;
  std::string linebuf;
  while (inStream->peek() != -1) {
    safeGetline(*inStream, linebuf);
    line_no++;

    // Trim trailing whitespace.
    if (linebuf.size() > 0) {
      linebuf = linebuf.substr(0, linebuf.find_last_not_of(" \t") + 1);
    }

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // new mtl
    if ((0 == strncmp(token, "newmtl", 6)) && IS_SPACE((token[6]))) {
      // flush previous material.
      if (!material.name.empty()) {
        material_map->insert(std::pair<std::string, int>(
            material.name, static_cast<int>(materials->size())));
        materials->push_back(material);
      }

      // initial temporary material
      InitMaterial(&material);

      has_d = false;
      has_tr = false;

      // set new mtl name
      token += 7;
      {
        std::stringstream sstr;
        sstr << token;
        material.name = sstr.str();
      }
      continue;
    }

    // ambient
    if (token[0] == 'K' && token[1] == 'a' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.ambient[0] = r;
      material.ambient[1] = g;
      material.ambient[2] = b;
      continue;
    }

    // diffuse
    if (token[0] == 'K' && token[1] == 'd' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.diffuse[0] = r;
      material.diffuse[1] = g;
      material.diffuse[2] = b;
      has_kd = true;
      continue;
    }

    // specular
    if (token[0] == 'K' && token[1] == 's' && IS_SPACE((token[2]))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.specular[0] = r;
      material.specular[1] = g;
      material.specular[2] = b;
      continue;
    }

    // transmittance
    if ((token[0] == 'K' && token[1] == 't' && IS_SPACE((token[2]))) ||
        (token[0] == 'T' && token[1] == 'f' && IS_SPACE((token[2])))) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.transmittance[0] = r;
      material.transmittance[1] = g;
      material.transmittance[2] = b;
      continue;
    }

    // ior(index of refraction)
    if (token[0] == 'N' && token[1] == 'i' && IS_SPACE((token[2]))) {
      token += 2;
      material.ior = parseReal(&token);
      continue;
    }

    // emission
    if (token[0] == 'K' && token[1] == 'e' && IS_SPACE(token[2])) {
      token += 2;
      real_t r, g, b;
      parseReal3(&r, &g, &b, &token);
      material.emission[0] = r;
      material.emission[1] = g;
      material.emission[2] = b;
      continue;
    }

    // shininess
    if (token[0] == 'N' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.shininess = parseReal(&token);
      continue;
    }

    // illum model
    if (0 == strncmp(token, "illum", 5) && IS_SPACE(token[5])) {
      token += 6;
      material.illum = parseInt(&token);
      continue;
    }

    // dissolve
    if ((token[0] == 'd' && IS_SPACE(token[1]))) {
      token += 1;
      material.dissolve = parseReal(&token);

      if (has_tr) {
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      }
      has_d = true;
      continue;
    }
    if (token[0] == 'T' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      if (has_d) {
        // `d` wins. Ignore `Tr` value.
        warn_ss << "Both `d` and `Tr` parameters defined for \""
                << material.name
                << "\". Use the value of `d` for dissolve (line " << line_no
                << " in .mtl.)" << std::endl;
      } else {
        // We invert value of Tr(assume Tr is in range [0, 1])
        // NOTE: Interpretation of Tr is application(exporter) dependent. For
        // some application(e.g. 3ds max obj exporter), Tr = d(Issue 43)
        material.dissolve = static_cast<real_t>(1.0) - parseReal(&token);
      }
      has_tr = true;
      continue;
    }

    // PBR: roughness
    if (token[0] == 'P' && token[1] == 'r' && IS_SPACE(token[2])) {
      token += 2;
      material.roughness = parseReal(&token);
      continue;
    }

    // PBR: metallic
    if (token[0] == 'P' && token[1] == 'm' && IS_SPACE(token[2])) {
      token += 2;
      material.metallic = parseReal(&token);
      continue;
    }

    // PBR: sheen
    if (token[0] == 'P' && token[1] == 's' && IS_SPACE(token[2])) {
      token += 2;
      material.sheen = parseReal(&token);
      continue;
    }

    // PBR: clearcoat thickness
    if (token[0] == 'P' && token[1] == 'c' && IS_SPACE(token[2])) {
      token += 2;
      material.clearcoat_thickness = parseReal(&token);
      continue;
    }

    // PBR: clearcoat roughness
    if ((0 == strncmp(token, "Pcr", 3)) && IS_SPACE(token[3])) {
      token += 4;
      material.clearcoat_roughness = parseReal(&token);
      continue;
    }

    // PBR: anisotropy
    if ((0 == strncmp(token, "aniso", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.anisotropy = parseReal(&token);
      continue;
    }

    // PBR: anisotropy rotation
    if ((0 == strncmp(token, "anisor", 6)) && IS_SPACE(token[6])) {
      token += 7;
      material.anisotropy_rotation = parseReal(&token);
      continue;
    }

    // ambient texture
    if ((0 == strncmp(token, "map_Ka", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.ambient_texname),
                                &(material.ambient_texopt), token);
      continue;
    }

    // diffuse texture
    if ((0 == strncmp(token, "map_Kd", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.diffuse_texname),
                                &(material.diffuse_texopt), token);

      // Set a decent diffuse default value if a diffuse texture is specified
      // without a matching Kd value.
      if (!has_kd)
      {
        material.diffuse[0] = static_cast<real_t>(0.6);
        material.diffuse[1] = static_cast<real_t>(0.6);
        material.diffuse[2] = static_cast<real_t>(0.6);
      }

      continue;
    }

    // specular texture
    if ((0 == strncmp(token, "map_Ks", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_texname),
                                &(material.specular_texopt), token);
      continue;
    }

    // specular highlight texture
    if ((0 == strncmp(token, "map_Ns", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.specular_highlight_texname),
                                &(material.specular_highlight_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "map_Bump", 8)) && IS_SPACE(token[8])) {
      token += 9;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // bump texture
    if ((0 == strncmp(token, "bump", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.bump_texname),
                                &(material.bump_texopt), token);
      continue;
    }

    // alpha texture
    if ((0 == strncmp(token, "map_d", 5)) && IS_SPACE(token[5])) {
      token += 6;
      material.alpha_texname = token;
      ParseTextureNameAndOption(&(material.alpha_texname),
                                &(material.alpha_texopt), token);
      continue;
    }

    // displacement texture
    if ((0 == strncmp(token, "disp", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.displacement_texname),
                                &(material.displacement_texopt), token);
      continue;
    }

    // reflection map
    if ((0 == strncmp(token, "refl", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.reflection_texname),
                                &(material.reflection_texopt), token);
      continue;
    }

    // PBR: roughness texture
    if ((0 == strncmp(token, "map_Pr", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.roughness_texname),
                                &(material.roughness_texopt), token);
      continue;
    }

    // PBR: metallic texture
    if ((0 == strncmp(token, "map_Pm", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.metallic_texname),
                                &(material.metallic_texopt), token);
      continue;
    }

    // PBR: sheen texture
    if ((0 == strncmp(token, "map_Ps", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.sheen_texname),
                                &(material.sheen_texopt), token);
      continue;
    }

    // PBR: emissive texture
    if ((0 == strncmp(token, "map_Ke", 6)) && IS_SPACE(token[6])) {
      token += 7;
      ParseTextureNameAndOption(&(material.emissive_texname),
                                &(material.emissive_texopt), token);
      continue;
    }

    // PBR: normal map texture
    if ((0 == strncmp(token, "norm", 4)) && IS_SPACE(token[4])) {
      token += 5;
      ParseTextureNameAndOption(&(material.normal_texname),
                                &(material.normal_texopt), token);
      continue;
    }

    // unknown parameter
    const char *_space = strchr(token, ' ');
    if (!_space) {
      _space = strchr(token, '\t');
    }
    if (_space) {
      std::ptrdiff_t len = _space - token;
      std::string key(token, static_cast<size_t>(len));
      std::string value = _space + 1;
      material.unknown_parameter.insert(
          std::pair<std::string, std::string>(key, value));
    }
  }
  // flush last material.
  material_map->insert(std::pair<std::string, int>(
      material.name, static_cast<int>(materials->size())));
  materials->push_back(material);

  if (warning) {
    (*warning) = warn_ss.str();
  }
}